

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,cmDuration timeout,Encoding encoding)

{
  pointer pcVar1;
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  StdioConfiguration SVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  cmUVProcessChainBuilder *pcVar9;
  size_t sVar10;
  uv_loop_t *puVar11;
  ulong uVar12;
  Status *this;
  ostream *poVar13;
  bool bVar14;
  bool timedOut;
  cmProcessOutput processOutput;
  bool errFinished;
  bool outFinished;
  OutputOption outputflag_local;
  undefined1 local_1c8 [8];
  cmUVProcessChain chain;
  StdioConfiguration local_1b8;
  StdioConfiguration local_1b0;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<char,_std::allocator<char>_> tempStdOut;
  anon_class_24_3_3cd7b453 startRead;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  uv_timer_ptr timer;
  uv_pipe_ptr errStream;
  uv_pipe_ptr outStream;
  string local_108;
  string local_e8;
  string local_c8;
  rep local_a8;
  cmUVProcessChainBuilder builder;
  
  outputflag_local = outputflag;
  local_a8 = timeout.__r;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  pcVar9 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_INPUT,_stdin);
  cmUVProcessChainBuilder::AddCommand(pcVar9,command);
  if (dir != (char *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    sVar10 = strlen(dir);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,dir,dir + sVar10);
    cmUVProcessChainBuilder::SetWorkingDirectory(&builder,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (outputflag_local == OUTPUT_MERGE) {
LAB_0011248a:
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(&builder);
  }
  else {
    if (outputflag_local != OUTPUT_PASSTHROUGH) {
      bVar14 = captureStdErr != (string *)0x0;
      if (captureStdErr != captureStdOut || captureStdErr == (string *)0x0) {
        pcVar9 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
        cmUVProcessChainBuilder::SetBuiltinStream(pcVar9,Stream_ERROR);
        goto LAB_0011249c;
      }
      goto LAB_0011248a;
    }
    pcVar9 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_OUTPUT,_stdout);
    cmUVProcessChainBuilder::SetExternalStream(pcVar9,Stream_ERROR,_stderr);
    captureStdOut = (string *)0x0;
  }
  bVar14 = false;
  captureStdErr = (string *)0x0;
LAB_0011249c:
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((local_a8 != 0.0) || (NAN(local_a8))) {
    puVar11 = cmUVProcessChain::GetLoop(&chain);
    cm::uv_timer_ptr::init(&timer,(EVP_PKEY_CTX *)puVar11);
    uVar12 = (ulong)(local_a8 * 1000.0);
    cm::uv_timer_ptr::start
              (&timer,RunSingleCommand::anon_class_1_0_00000001::__invoke,
               (long)(local_a8 * 1000.0 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12,0);
  }
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  outStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  errStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  errStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
  local_1b0.Type = None;
  local_1b0.FileDescriptor = 0;
  local_1b8.Type = None;
  local_1b8.FileDescriptor = 0;
  if ((outputflag_local != OUTPUT_PASSTHROUGH) &&
     ((bool)(captureStdOut != (string *)0x0 | bVar14 | outputflag_local != OUTPUT_NONE))) {
    startRead.outputflag = &outputflag_local;
    startRead.processOutput = &processOutput;
    startRead.chain = &chain;
    uVar6 = cmUVProcessChain::OutputStream(&chain);
    RunSingleCommand::anon_class_24_3_3cd7b453::operator()
              ((anon_class_24_3_3cd7b453 *)local_1c8,(uv_pipe_ptr *)&startRead,(int)&outStream,
               (string *)(ulong)uVar6,(vector<char,_std::allocator<char>_> *)captureStdOut,
               (int)&tempStdOut,(_func_void_string_ptr *)0x1,(bool *)Stdout);
    SVar4 = local_1b0;
    auVar2 = local_1c8;
    local_1c8._0_4_ = None;
    local_1c8._4_4_ = 0;
    auVar3 = local_1c8;
    local_1c8._0_4_ = auVar2._0_4_;
    local_1c8._4_4_ = auVar2._4_4_;
    local_1b0.Type = local_1c8._0_4_;
    local_1b0.FileDescriptor = local_1c8._4_4_;
    local_1c8 = auVar3;
    if ((SVar4 != (StdioConfiguration)0x0) &&
       (std::default_delete<cmUVStreamReadHandle>::operator()
                  ((default_delete<cmUVStreamReadHandle> *)&local_1b0,(cmUVStreamReadHandle *)SVar4)
       , (StdioConfiguration)local_1c8 != (StdioConfiguration)0x0)) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)local_1c8,(cmUVStreamReadHandle *)local_1c8
                );
    }
    iVar7 = cmUVProcessChain::OutputStream(&chain);
    iVar8 = cmUVProcessChain::ErrorStream(&chain);
    if (iVar7 != iVar8) {
      uVar6 = cmUVProcessChain::ErrorStream(&chain);
      RunSingleCommand::anon_class_24_3_3cd7b453::operator()
                ((anon_class_24_3_3cd7b453 *)local_1c8,(uv_pipe_ptr *)&startRead,(int)&errStream,
                 (string *)(ulong)uVar6,(vector<char,_std::allocator<char>_> *)captureStdErr,
                 (int)&tempStdErr,(_func_void_string_ptr *)0x2,(bool *)Stderr);
      SVar4 = local_1b8;
      auVar2 = local_1c8;
      local_1c8._0_4_ = None;
      local_1c8._4_4_ = 0;
      auVar3 = local_1c8;
      local_1c8._0_4_ = auVar2._0_4_;
      local_1c8._4_4_ = auVar2._4_4_;
      local_1b8.Type = local_1c8._0_4_;
      local_1b8.FileDescriptor = local_1c8._4_4_;
      local_1c8 = auVar3;
      if ((SVar4 != (StdioConfiguration)0x0) &&
         (std::default_delete<cmUVStreamReadHandle>::operator()
                    ((default_delete<cmUVStreamReadHandle> *)&local_1b8,
                     (cmUVStreamReadHandle *)SVar4),
         (StdioConfiguration)local_1c8 != (StdioConfiguration)0x0)) {
        std::default_delete<cmUVStreamReadHandle>::operator()
                  ((default_delete<cmUVStreamReadHandle> *)local_1c8,
                   (cmUVStreamReadHandle *)local_1c8);
      }
    }
  }
  while (bVar5 = cmUVProcessChain::Finished(&chain), !bVar5) {
    puVar11 = cmUVProcessChain::GetLoop(&chain);
    uv_run(puVar11,UV_RUN_ONCE);
  }
  if (captureStdOut != (string *)0x0) {
    pcVar1 = (captureStdOut->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdOut,pcVar1,pcVar1 + captureStdOut->_M_string_length,
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    pcVar1 = (captureStdOut->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar1,pcVar1 + captureStdOut->_M_string_length);
    cmProcessOutput::DecodeText(&processOutput,&local_e8,captureStdOut,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar14) {
    pcVar1 = (captureStdErr->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)captureStdErr,pcVar1,pcVar1 + captureStdErr->_M_string_length,
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    pcVar1 = (captureStdErr->_M_dataplus)._M_p;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar1,pcVar1 + captureStdErr->_M_string_length);
    cmProcessOutput::DecodeText(&processOutput,&local_108,captureStdErr,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  this = cmUVProcessChain::GetStatus(&chain,0);
  cmUVProcessChain::Status::GetException_abi_cxx11_
            ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&startRead,this);
  if ((int)startRead.outputflag == 0) {
    if (retVal == (int *)0x0) {
      bVar14 = this->ExitStatus == 0;
    }
    else {
      *retVal = (int)this->ExitStatus;
      bVar14 = true;
    }
  }
  else {
    if (outputflag_local != OUTPUT_NONE) {
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)startRead.processOutput,
                           (long)startRead.chain);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    if (!(bool)(~bVar14 & captureStdOut == (string *)0x0)) {
      if (bVar14) {
        captureStdOut = captureStdErr;
      }
      std::__cxx11::string::_M_append((char *)captureStdOut,(ulong)startRead.processOutput);
    }
    bVar14 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)startRead.processOutput != &local_158) {
    operator_delete(startRead.processOutput,local_158._M_allocated_capacity + 1);
  }
  if (local_1b8 != (StdioConfiguration)0x0) {
    std::default_delete<cmUVStreamReadHandle>::operator()
              ((default_delete<cmUVStreamReadHandle> *)&local_1b8,(cmUVStreamReadHandle *)local_1b8)
    ;
  }
  if (local_1b0 != (StdioConfiguration)0x0) {
    std::default_delete<cmUVStreamReadHandle>::operator()
              ((default_delete<cmUVStreamReadHandle> *)&local_1b0,(cmUVStreamReadHandle *)local_1b0)
    ;
  }
  cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&errStream);
  cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&outStream);
  if (tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_timer_s> *)&timer);
  cmUVProcessChain::~cmUVProcessChain(&chain);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)builder.WorkingDirectory._M_dataplus._M_p != &builder.WorkingDirectory.field_2) {
    operator_delete(builder.WorkingDirectory._M_dataplus._M_p,
                    builder.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&builder.Processes);
  return bVar14;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string> const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr, int* retVal,
                                     const char* dir, OutputOption outputflag,
                                     cmDuration timeout, Encoding encoding)
{
  cmUVProcessChainBuilder builder;
  builder.SetExternalStream(cmUVProcessChainBuilder::Stream_INPUT, stdin)
    .AddCommand(command);
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }

  if (outputflag == OUTPUT_PASSTHROUGH) {
    captureStdOut = nullptr;
    captureStdErr = nullptr;
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  } else if (outputflag == OUTPUT_MERGE ||
             (captureStdErr && captureStdErr == captureStdOut)) {
    builder.SetMergedBuiltinStreams();
    captureStdErr = nullptr;
  } else {
    builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
      .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
  }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  auto chain = builder.Start();
  bool timedOut = false;
  cm::uv_timer_ptr timer;
  if (timeout.count()) {
    timer.init(chain.GetLoop(), &timedOut);
    timer.start(
      [](uv_timer_t* t) {
        auto* timedOutPtr = static_cast<bool*>(t->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);
  }

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  cm::uv_pipe_ptr outStream;
  bool outFinished = true;
  cm::uv_pipe_ptr errStream;
  bool errFinished = true;
  cmProcessOutput processOutput(encoding);
  std::unique_ptr<cmUVStreamReadHandle> outputHandle;
  std::unique_ptr<cmUVStreamReadHandle> errorHandle;
  if (outputflag != OUTPUT_PASSTHROUGH &&
      (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)) {
    auto startRead =
      [&outputflag, &processOutput,
       &chain](cm::uv_pipe_ptr& pipe, int stream, std::string* captureStd,
               std::vector<char>& tempStd, int id,
               void (*outputFunc)(const std::string&),
               bool& finished) -> std::unique_ptr<cmUVStreamReadHandle> {
      if (stream < 0) {
        return nullptr;
      }

      pipe.init(chain.GetLoop(), 0);
      uv_pipe_open(pipe, stream);

      finished = false;
      return cmUVStreamRead(
        pipe,
        [outputflag, &processOutput, captureStd, &tempStd, id,
         outputFunc](std::vector<char> data) {
          // Translate NULL characters in the output into valid text.
          for (auto& c : data) {
            if (c == '\0') {
              c = ' ';
            }
          }

          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(data.data(), data.size(), strdata, id);
            outputFunc(strdata);
          }
          if (captureStd) {
            cm::append(tempStd, data.data(), data.data() + data.size());
          }
        },
        [&finished, outputflag, &processOutput, id, outputFunc]() {
          finished = true;
          if (outputflag != OUTPUT_NONE) {
            std::string strdata;
            processOutput.DecodeText(std::string(), strdata, id);
            if (!strdata.empty()) {
              outputFunc(strdata);
            }
          }
        });
    };

    outputHandle =
      startRead(outStream, chain.OutputStream(), captureStdOut, tempStdOut, 1,
                cmSystemTools::Stdout, outFinished);
    if (chain.OutputStream() != chain.ErrorStream()) {
      errorHandle =
        startRead(errStream, chain.ErrorStream(), captureStdErr, tempStdErr, 2,
                  cmSystemTools::Stderr, errFinished);
    }
  }

  while (!timedOut && !(chain.Finished() && outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }

  if (captureStdOut) {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    processOutput.DecodeText(*captureStdOut, *captureStdOut);
  }
  if (captureStdErr) {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    processOutput.DecodeText(*captureStdErr, *captureStdErr);
  }

  bool result = true;
  if (timedOut) {
    const char* error_str = "Process terminated due to timeout\n";
    if (outputflag != OUTPUT_NONE) {
      std::cerr << error_str << std::endl;
    }
    if (captureStdErr) {
      captureStdErr->append(error_str, strlen(error_str));
    }
    result = false;
  } else {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();

    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (retVal) {
          *retVal = static_cast<int>(status.ExitStatus);
        } else {
          if (status.ExitStatus != 0) {
            result = false;
          }
        }
        break;
      default: {
        if (outputflag != OUTPUT_NONE) {
          std::cerr << exception.second << std::endl;
        }
        if (captureStdErr) {
          captureStdErr->append(exception.second);
        } else if (captureStdOut) {
          captureStdOut->append(exception.second);
        }
        result = false;
      } break;
    }
  }

  return result;
}